

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_generic.h
# Opt level: O2

int m2v_LU_decomp_inplace(m2v *A,int *rp,int *cp)

{
  int iVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  int r1;
  int j;
  int r;
  int iVar7;
  ulong uVar8;
  int *local_50;
  
  for (lVar3 = 0; lVar3 < A->n_row; lVar3 = lVar3 + 1) {
    rp[lVar3] = (int)lVar3;
  }
  for (lVar3 = 0; uVar4 = (ulong)A->n_col, lVar3 < (long)uVar4; lVar3 = lVar3 + 1) {
    cp[lVar3] = (int)lVar3;
  }
  uVar5 = 0;
  local_50 = rp;
  do {
    r1 = (int)uVar5;
    if (((long)(int)uVar4 <= (long)uVar5) || (iVar7 = A->n_row, (long)iVar7 <= (long)uVar5)) {
      return r1;
    }
    uVar6 = uVar5 & 0xffffffff;
LAB_00102ff4:
    iVar2 = (int)uVar6;
    if (iVar2 == (int)uVar4) {
      return r1;
    }
    lVar3 = 0;
    uVar8 = uVar5 & 0xffffffff;
    while( true ) {
      r = (int)uVar8;
      if (iVar7 == r) goto LAB_00103021;
      iVar1 = m2v_get_el(A,r,iVar2);
      if (iVar1 != 0) break;
      uVar8 = (ulong)(r + 1);
      lVar3 = lVar3 + 4;
    }
    if (lVar3 != 0) {
      iVar7 = *(int *)((long)local_50 + lVar3);
      *(int *)((long)local_50 + lVar3) = rp[uVar5];
      rp[uVar5] = iVar7;
      m2v_swap_rows(A,r1,r);
    }
    if (uVar5 != uVar6) {
      iVar7 = cp[uVar6];
      cp[uVar6] = cp[uVar5];
      cp[uVar5] = iVar7;
      m2v_swap_cols(A,iVar2,r1);
    }
    uVar5 = uVar5 + 1;
    uVar4 = uVar5 & 0xffffffff;
    while (iVar7 = (int)uVar4, iVar7 < A->n_row) {
      iVar2 = m2v_get_el(A,iVar7,r1);
      m2v_multadd_row_from(A,r1,r1 + 1,iVar2,A,iVar7);
      uVar4 = (ulong)(iVar7 + 1);
    }
    uVar4 = (ulong)(uint)A->n_col;
    local_50 = local_50 + 1;
  } while( true );
LAB_00103021:
  uVar6 = (ulong)(iVar2 + 1);
  goto LAB_00102ff4;
}

Assistant:

int MV_GEN_N(_LU_decomp_inplace)(MV_GEN_TYPE* A,
				int* rp,
				int* cp)
{
	/* Initialize permutations */
	int i;
	for (i = 0; i < A->n_row; ++i)
		rp[i] = i;
	for (i = 0; i < A->n_col; ++i)
		cp[i] = i;

	/* LU decomposition */
	for (i = 0; i < A->n_col && i < A->n_row; ++i) {
		/* Find a pivot
		 *
		 * We must pick in A to process that does not lead to a
		 * zero value on the diagonal of U, for otherwise we
		 * can't keep processing.
		 *
		 * Find a row such that the resulting U[i,i]
		 * will be nonzero.
		 */
		int prow;
		int pcol;
		for (pcol = i; pcol < A->n_col; ++pcol) {
			for (prow = i; prow < A->n_row; ++prow) {
				if (MV_GEN_N(_get_el)(A, prow, pcol) != 0) {
					goto pivot_found;
				}
			}
		}

		/* No pivot found; maximum rank reached */
		assert (pcol == A->n_col);
		break;
pivot_found:

		/* Permute row and column to get pivot into place,
		   and record */
		if (prow != i) {
			SwapInt(rp[i], rp[prow]);
			MV_GEN_N(_swap_rows)(A, i, prow);
		}
		if (pcol != i) {
			SwapInt(cp[i], cp[pcol]);
			MV_GEN_N(_swap_cols)(A, pcol, i);
		}

		/* At this point, the row i of U is computed correctly
		 * already, due to the updates to a (see below, "update
		 * A in the undecomposed part").  The column i of L is
		 * not quite correct yet; we need to divide the entries
		 * by Uii.
		 */

		/* Compute the column i of L */
		MV_GEN_ELTYPE Uii_inv = finv(MV_GEN_N(_get_el)(A, i, i));
		MV_GEN_N(_mult_col_from)(A, i, i + 1, Uii_inv);

		/* Update A in the yet undecomposed part */
		for (int j = i + 1; j < A->n_row; ++j) {
			const MV_GEN_ELTYPE Lji = MV_GEN_N(_get_el)(A, j, i);
			MV_GEN_N(_multadd_row_from)(A, i, i + 1, Lji, A, j);
		}
	}

	/* At this point, i is the rank of the matrix */
	return i;
}